

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_muls_16_pd(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  ulong uVar3;
  
  uVar1 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar3 = (ulong)(uVar1 >> 7 & 0x1c);
  uVar2 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  m68ki_cpu.not_z_flag = (int)*(short *)((long)m68ki_cpu.dar + uVar3) * (int)(short)uVar2;
  *(uint *)((long)m68ki_cpu.dar + uVar3) = m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_muls_16_pd(void)
{
	uint* r_dst = &DX;
	uint res = MASK_OUT_ABOVE_32(MAKE_INT_16(OPER_AY_PD_16()) * MAKE_INT_16(MASK_OUT_ABOVE_16(*r_dst)));

	*r_dst = res;

	FLAG_Z = res;
	FLAG_N = NFLAG_32(res);
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}